

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_and_cardinality(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  leaf_t leaf;
  leaf_t leaf_00;
  uint8_t uVar1;
  int iVar2;
  leaf_t leaf2;
  leaf_t leaf1;
  int compare_result;
  art_iterator_t it2;
  art_iterator_t it1;
  uint64_t result;
  art_key_chunk_t *in_stack_fffffffffffffe88;
  roaring64_bitmap_t *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  _Bool in_stack_fffffffffffffe9f;
  art_t *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 uVar3;
  leaf_t *local_130;
  leaf_t *local_a0;
  uint64_t local_18;
  
  local_18 = 0;
  art_init_iterator(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
  art_init_iterator(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
  while (uVar3 = local_a0 != (leaf_t *)0x0 && local_130 != (leaf_t *)0x0,
        local_a0 != (leaf_t *)0x0 && local_130 != (leaf_t *)0x0) {
    iVar2 = compare_high48((art_key_chunk_t *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (iVar2 == 0) {
      leaf = *local_a0;
      leaf_00 = *local_130;
      in_stack_fffffffffffffe90 =
           (roaring64_bitmap_t *)
           get_container(in_stack_fffffffffffffe90,(leaf_t)in_stack_fffffffffffffe88);
      uVar1 = get_typecode(leaf);
      in_stack_fffffffffffffea0 =
           (art_t *)get_container(in_stack_fffffffffffffe90,(leaf_t)in_stack_fffffffffffffe88);
      get_typecode(leaf_00);
      iVar2 = container_and_cardinality
                        ((container_t *)CONCAT17(uVar3,in_stack_fffffffffffffea8),
                         (uint8_t)((ulong)in_stack_fffffffffffffea0 >> 0x38),
                         (container_t *)CONCAT17(uVar1,in_stack_fffffffffffffe98),
                         (uint8_t)((ulong)in_stack_fffffffffffffe90 >> 0x38));
      local_18 = (long)iVar2 + local_18;
      art_iterator_next((art_iterator_t *)0x12019b);
      art_iterator_next((art_iterator_t *)0x1201a5);
    }
    else if (iVar2 < 0) {
      art_iterator_lower_bound
                ((art_iterator_t *)CONCAT17(uVar3,in_stack_fffffffffffffea8),
                 (art_key_chunk_t *)in_stack_fffffffffffffea0);
    }
    else {
      art_iterator_lower_bound
                ((art_iterator_t *)CONCAT17(uVar3,in_stack_fffffffffffffea8),
                 (art_key_chunk_t *)in_stack_fffffffffffffea0);
    }
  }
  return local_18;
}

Assistant:

uint64_t roaring64_bitmap_and_cardinality(const roaring64_bitmap_t *r1,
                                          const roaring64_bitmap_t *r2) {
    uint64_t result = 0;

    art_iterator_t it1 = art_init_iterator((art_t *)&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL && it2.value != NULL) {
        // Cases:
        // 1. it1 <  it2 -> it1++
        // 2. it1 == it1 -> output cardinaltiy it1 & it2, it1++, it2++
        // 3. it1 >  it2 -> it2++
        int compare_result = compare_high48(it1.key, it2.key);
        if (compare_result == 0) {
            // Case 2: iterators at the same high key position.
            leaf_t leaf1 = (leaf_t)*it1.value;
            leaf_t leaf2 = (leaf_t)*it2.value;
            result += container_and_cardinality(
                get_container(r1, leaf1), get_typecode(leaf1),
                get_container(r2, leaf2), get_typecode(leaf2));
            art_iterator_next(&it1);
            art_iterator_next(&it2);
        } else if (compare_result < 0) {
            // Case 1: it1 is before it2.
            art_iterator_lower_bound(&it1, it2.key);
        } else {
            // Case 3: it2 is before it1.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
    return result;
}